

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

int Sdb_StoDiffExactlyOne(Vec_Wec_t *vCuts,int Limit,int *pCut)

{
  uint uVar1;
  int Entry;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  iVar6 = 0;
  do {
    if (vCuts->nSize <= iVar6) {
      iVar6 = 0;
      do {
        if ((vCuts->nSize <= iVar6) || (pVVar5 = Vec_WecEntry(vCuts,iVar6), iVar6 == Limit)) {
          return -1;
        }
        uVar1 = *pCut;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        iVar3 = (int)uVar9 + 1;
        iVar2 = -1;
        for (lVar7 = 1; lVar7 - uVar9 != 1; lVar7 = lVar7 + 1) {
          Entry = pCut[lVar7];
          iVar4 = Vec_IntFind(pVVar5,Entry);
          iVar8 = iVar2;
          if ((iVar4 < 0) && (iVar8 = Entry, iVar2 != -1)) {
            iVar3 = (int)lVar7;
            break;
          }
          iVar2 = iVar8;
        }
        iVar6 = iVar6 + 1;
        if ((iVar3 == uVar1 + 1) && (iVar2 != -1)) {
          return iVar2;
        }
      } while( true );
    }
    pVVar5 = Vec_WecEntry(vCuts,iVar6);
    uVar1 = *pCut;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    iVar2 = (int)uVar9 + 1;
    for (lVar7 = 1; lVar7 - uVar9 != 1; lVar7 = lVar7 + 1) {
      iVar3 = Vec_IntFind(pVVar5,pCut[lVar7]);
      if (iVar3 == -1) {
        iVar2 = (int)lVar7;
        break;
      }
    }
    iVar6 = iVar6 + 1;
    if (iVar2 == uVar1 + 1) {
      return -1;
    }
  } while( true );
}

Assistant:

int Sdb_StoDiffExactlyOne( Vec_Wec_t * vCuts, int Limit, int * pCut )
{
    Vec_Int_t * vCut;  
    int i, k, iNew;
    // check if it is fully contained in any one
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        for ( k = 1; k <= pCut[0]; k++ )
            if ( Vec_IntFind(vCut, pCut[k]) == -1 )
                break;
        if ( k == pCut[0] + 1 )
            return -1;
    }
    // check if there is one different
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        if ( i == Limit )
            break;
        for ( iNew = -1, k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
            return iNew;
    }
    return -1;
}